

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O3

void zsummer::log4z::GetProcessInfo(string *name,string *pid)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  long lVar3;
  char buf [260];
  long *local_158 [2];
  long local_148 [2];
  char local_138 [264];
  
  std::__cxx11::string::_M_replace((ulong)name,0,(char *)name->_M_string_length,0x130720);
  std::__cxx11::string::_M_replace((ulong)pid,0,(char *)pid->_M_string_length,0x13002b);
  uVar1 = getpid();
  sprintf(local_138,"/proc/%d/cmdline",(ulong)uVar1);
  __stream = fopen(local_138,"r");
  if (__stream != (FILE *)0x0) {
    pcVar2 = fgets(local_138,0x103,__stream);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = (char *)name->_M_string_length;
      strlen(local_138);
      std::__cxx11::string::_M_replace((ulong)name,0,pcVar2,(ulong)local_138);
    }
    fclose(__stream);
    lVar3 = std::__cxx11::string::rfind((char *)name,0x13085b,0xffffffffffffffff);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_158,(ulong)name);
      std::__cxx11::string::operator=((string *)name,(string *)local_158);
      if (local_158[0] != local_148) {
        operator_delete(local_158[0],local_148[0] + 1);
      }
    }
    sprintf(local_138,"%06d",(ulong)uVar1);
    pcVar2 = (char *)pid->_M_string_length;
    strlen(local_138);
    std::__cxx11::string::_M_replace((ulong)pid,0,pcVar2,(ulong)local_138);
  }
  return;
}

Assistant:

void GetProcessInfo(std::string &name, std::string &pid)
{
	name = "MainLog";
	pid = "0";
#ifdef WIN32

	char buf[260] = {0};
	if (GetModuleFileNameA(NULL, buf, 259) > 0)
	{
		name = buf;
	}
	std::string::size_type pos = name.rfind("\\");
	if (pos != std::string::npos)
	{
		name = name.substr(pos+1, std::string::npos);
	}
	pos = name.rfind(".");
	if (pos != std::string::npos)
	{
		name = name.substr(0, pos-0);
	}
	DWORD pidd = GetCurrentProcessId();
	sprintf(buf, "%06d", pidd);
	pid = buf;
#else
	pid_t id = getpid();
	char buf[260];
	sprintf(buf, "/proc/%d/cmdline", (int)id);
	CLog4zFile i;
	i.Open(buf, "r");
	if (!i.IsOpen())
	{
		return ;
	}
	if (i.ReadLine(buf, 259))
	{
		name = buf;
	}
	i.Close();

	std::string::size_type pos = name.rfind("/");
	if (pos != std::string::npos)
	{
		name = name.substr(pos+1, std::string::npos);
	}
	sprintf(buf, "%06d", id);
	pid = buf;
#endif
}